

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  NodeRef *pNVar1;
  RTCRayQueryContext *pRVar2;
  undefined1 auVar3 [16];
  RTCRayQueryContext *pRVar4;
  undefined4 uVar5;
  undefined1 *puVar6;
  ulong uVar7;
  ulong uVar8;
  RTCIntersectFunctionN p_Var9;
  uint uVar10;
  uint i;
  long lVar12;
  NodeRef *pNVar13;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar14;
  size_t i_1;
  ulong uVar15;
  RTCRayQueryContext *pRVar16;
  int iVar17;
  int iVar18;
  float fVar19;
  float fVar25;
  float fVar26;
  vint4 bi;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar27;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar30;
  undefined1 auVar31 [16];
  float fVar32;
  float fVar37;
  float fVar38;
  vint4 bi_1;
  float fVar39;
  undefined1 auVar33 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar40;
  float fVar43;
  float fVar44;
  vint4 ai;
  undefined1 auVar41 [16];
  float fVar45;
  undefined1 auVar42 [16];
  float fVar46;
  float fVar48;
  float fVar49;
  vint4 ai_1;
  undefined1 auVar47 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  vint4 ai_3;
  float fVar54;
  uint uVar57;
  uint uVar58;
  vint4 bi_2;
  undefined1 auVar55 [16];
  uint uVar59;
  undefined1 auVar56 [16];
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  vint4 bi_3;
  float fVar66;
  float fVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  vint4 ai_2;
  uint uVar71;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  int iVar84;
  int iVar85;
  undefined1 local_1808 [16];
  vint4 bi_8;
  RTCIntersectFunctionNArguments local_17d0;
  Geometry *local_17a0;
  undefined8 local_1798;
  RTCIntersectArguments *local_1790;
  float local_1788;
  float fStack_1784;
  float fStack_1780;
  float fStack_177c;
  float local_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float local_1768;
  float fStack_1764;
  float fStack_1760;
  float fStack_175c;
  uint local_1758;
  uint uStack_1754;
  uint uStack_1750;
  uint uStack_174c;
  uint local_1748;
  uint uStack_1744;
  uint uStack_1740;
  uint uStack_173c;
  undefined1 local_1738 [16];
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined1 local_1718 [8];
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16f8;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  RTCRayQueryContext *pRVar11;
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       (((ulong)*(Scene **)&context->args->flags & 0x10000) != 0)) {
      occludedCoherent((BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
                        *)valid_i,(vint<4> *)This,(Intersectors *)ray,(RayK<4> *)context,
                       (RayQueryContext *)context->args);
      return;
    }
    auVar22 = *(undefined1 (*) [16])(ray + 0x80);
    uVar72 = -(uint)(0.0 <= auVar22._0_4_ && (valid_i->field_0).i[0] == -1);
    uVar73 = -(uint)(0.0 <= auVar22._4_4_ && (valid_i->field_0).i[1] == -1);
    uVar74 = -(uint)(0.0 <= auVar22._8_4_ && (valid_i->field_0).i[2] == -1);
    uVar75 = -(uint)(0.0 <= auVar22._12_4_ && (valid_i->field_0).i[3] == -1);
    auVar29._4_4_ = uVar73;
    auVar29._0_4_ = uVar72;
    auVar29._8_4_ = uVar74;
    auVar29._12_4_ = uVar75;
    uVar10 = movmskps((int)This,auVar29);
    pRVar11 = (RTCRayQueryContext *)(ulong)uVar10;
    if (uVar10 != 0) {
      auVar29 = *(undefined1 (*) [16])(ray + 0x40);
      fVar60 = (float)DAT_01f4bd50;
      fVar62 = DAT_01f4bd50._4_4_;
      fVar64 = DAT_01f4bd50._8_4_;
      fVar66 = DAT_01f4bd50._12_4_;
      auVar41._4_4_ = -(uint)(ABS(auVar29._4_4_) < fVar62);
      auVar41._0_4_ = -(uint)(ABS(auVar29._0_4_) < fVar60);
      auVar41._8_4_ = -(uint)(ABS(auVar29._8_4_) < fVar64);
      auVar41._12_4_ = -(uint)(ABS(auVar29._12_4_) < fVar66);
      auVar55 = blendvps(auVar29,_DAT_01f4bd50,auVar41);
      fVar76 = *(float *)ray;
      fVar77 = *(float *)(ray + 4);
      fVar78 = *(float *)(ray + 8);
      fVar79 = *(float *)(ray + 0xc);
      auVar29 = *(undefined1 (*) [16])(ray + 0x50);
      auVar47._4_4_ = -(uint)(ABS(auVar29._4_4_) < fVar62);
      auVar47._0_4_ = -(uint)(ABS(auVar29._0_4_) < fVar60);
      auVar47._8_4_ = -(uint)(ABS(auVar29._8_4_) < fVar64);
      auVar47._12_4_ = -(uint)(ABS(auVar29._12_4_) < fVar66);
      auVar41 = blendvps(auVar29,_DAT_01f4bd50,auVar47);
      auVar29 = *(undefined1 (*) [16])(ray + 0x60);
      iVar17 = -(uint)(ABS(auVar29._8_4_) < fVar64);
      iVar18 = -(uint)(ABS(auVar29._12_4_) < fVar66);
      auVar28._0_8_ =
           CONCAT44(-(uint)(ABS(auVar29._4_4_) < fVar62),-(uint)(ABS(auVar29._0_4_) < fVar60));
      auVar28._8_4_ = iVar17;
      auVar28._12_4_ = iVar18;
      auVar20._8_4_ = iVar17;
      auVar20._0_8_ = auVar28._0_8_;
      auVar20._12_4_ = iVar18;
      auVar47 = blendvps(auVar29,_DAT_01f4bd50,auVar20);
      auVar29 = rcpps(auVar28,auVar55);
      fVar80 = auVar29._0_4_;
      fVar81 = auVar29._4_4_;
      fVar82 = auVar29._8_4_;
      fVar83 = auVar29._12_4_;
      auVar29 = maxps(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0));
      iVar17 = (int)DAT_01f45a30;
      iVar18 = DAT_01f45a30._4_4_;
      iVar84 = DAT_01f45a30._8_4_;
      iVar85 = DAT_01f45a30._12_4_;
      auVar21._4_4_ = uVar73;
      auVar21._0_4_ = uVar72;
      auVar21._8_4_ = uVar74;
      auVar21._12_4_ = uVar75;
      local_16f8.v = (__m128)blendvps(_DAT_01f45a30,auVar29,auVar21);
      auVar29 = maxps(auVar22,ZEXT816(0));
      bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                     blendvps(_DAT_01f45a40,auVar29,auVar21);
      auVar22 = rcpps(auVar21,auVar41);
      local_1708 = auVar22._0_4_;
      fStack_1704 = auVar22._4_4_;
      fStack_1700 = auVar22._8_4_;
      fStack_16fc = auVar22._12_4_;
      auVar22 = rcpps(auVar29,auVar47);
      fVar60 = auVar22._0_4_;
      fVar62 = auVar22._4_4_;
      fVar64 = auVar22._8_4_;
      fVar66 = auVar22._12_4_;
      _local_1718 = *(undefined1 (*) [16])(ray + 0x10);
      local_1708 = (1.0 - auVar41._0_4_ * local_1708) * local_1708 + local_1708;
      fStack_1704 = (1.0 - auVar41._4_4_ * fStack_1704) * fStack_1704 + fStack_1704;
      fStack_1700 = (1.0 - auVar41._8_4_ * fStack_1700) * fStack_1700 + fStack_1700;
      fStack_16fc = (1.0 - auVar41._12_4_ * fStack_16fc) * fStack_16fc + fStack_16fc;
      local_1728 = *(undefined8 *)(ray + 0x20);
      uStack_1720 = *(undefined8 *)(ray + 0x28);
      fVar80 = (1.0 - auVar55._0_4_ * fVar80) * fVar80 + fVar80;
      fVar81 = (1.0 - auVar55._4_4_ * fVar81) * fVar81 + fVar81;
      fVar82 = (1.0 - auVar55._8_4_ * fVar82) * fVar82 + fVar82;
      fVar83 = (1.0 - auVar55._12_4_ * fVar83) * fVar83 + fVar83;
      local_1808._0_8_ = CONCAT44(uVar73,uVar72) ^ 0xffffffffffffffff;
      local_1808._8_4_ = uVar74 ^ 0xffffffff;
      local_1808._12_4_ = uVar75 ^ 0xffffffff;
      fVar60 = (1.0 - auVar47._0_4_ * fVar60) * fVar60 + fVar60;
      fVar62 = (1.0 - auVar47._4_4_ * fVar62) * fVar62 + fVar62;
      fVar64 = (1.0 - auVar47._8_4_ * fVar64) * fVar64 + fVar64;
      fVar66 = (1.0 - auVar47._12_4_ * fVar66) * fVar66 + fVar66;
      pNVar13 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar14 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_near[1].field_0 = local_16f8;
      puVar6 = mm_lookupmask_ps;
      _local_1748 = mm_lookupmask_ps._0_8_;
      _uStack_1740 = mm_lookupmask_ps._8_8_;
      local_1788 = fVar80;
      fStack_1784 = fVar81;
      fStack_1780 = fVar82;
      fStack_177c = fVar83;
      local_1778 = fVar60;
      fStack_1774 = fVar62;
      fStack_1770 = fVar64;
      fStack_176c = fVar66;
      local_1768 = fVar76;
      fStack_1764 = fVar77;
      fStack_1760 = fVar78;
      fStack_175c = fVar79;
      local_1758 = uVar72;
      uStack_1754 = uVar73;
      uStack_1750 = uVar74;
      uStack_174c = uVar75;
LAB_006d9afe:
      pNVar1 = pNVar13 + -1;
      if ((RTCRayQueryContext *)pNVar1->ptr != (RTCRayQueryContext *)&DAT_fffffffffffffff8) {
        pNVar13 = pNVar13 + -1;
        aVar30 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar14[-1].v;
        paVar14 = paVar14 + -1;
        auVar22._4_4_ = -(uint)(aVar30.v[1] < (float)bi_8.field_0.i[1]);
        auVar22._0_4_ = -(uint)(aVar30.v[0] < (float)bi_8.field_0.i[0]);
        auVar22._8_4_ = -(uint)(aVar30.v[2] < (float)bi_8.field_0.i[2]);
        auVar22._12_4_ = -(uint)(aVar30._12_4_ < (float)bi_8.field_0.i[3]);
        uVar10 = movmskps((int)puVar6,auVar22);
        puVar6 = (undefined1 *)(ulong)uVar10;
        pRVar16 = (RTCRayQueryContext *)pNVar1->ptr;
        if (uVar10 != 0) {
          do {
            if (((ulong)pRVar16 & 8) != 0) {
              if (pRVar16 == (RTCRayQueryContext *)&DAT_fffffffffffffff8) goto LAB_006d9e2f;
              auVar55._4_4_ = -(uint)(aVar30.v[1] < (float)bi_8.field_0.i[1]);
              auVar55._0_4_ = -(uint)(aVar30.v[0] < (float)bi_8.field_0.i[0]);
              auVar55._8_4_ = -(uint)(aVar30.v[2] < (float)bi_8.field_0.i[2]);
              auVar55._12_4_ = -(uint)(aVar30.v[3] < (float)bi_8.field_0.i[3]);
              uVar10 = movmskps((int)puVar6,auVar55);
              puVar6 = (undefined1 *)(ulong)uVar10;
              if (uVar10 != 0) {
                uVar7 = (ulong)((uint)pRVar16 & 0xf) - 8;
                auVar3._8_4_ = 0xffffffff;
                auVar3._0_8_ = 0xffffffffffffffff;
                auVar3._12_4_ = 0xffffffff;
                uVar15 = 0;
                uVar8 = uVar7;
                auVar42 = local_1808 ^ auVar3;
                goto LAB_006d9ccd;
              }
              break;
            }
            puVar6 = (undefined1 *)((ulong)pRVar16 & 0xfffffffffffffff0);
            aVar30.i[1] = iVar18;
            aVar30.i[0] = iVar17;
            aVar30.i[2] = iVar84;
            aVar30.i[3] = iVar85;
            pRVar11 = (RTCRayQueryContext *)0x8;
            for (lVar12 = 0;
                (lVar12 != 4 &&
                (pRVar2 = *(RTCRayQueryContext **)(puVar6 + lVar12 * 8),
                pRVar2 != (RTCRayQueryContext *)0x8)); lVar12 = lVar12 + 1) {
              fVar67 = (float)pRVar16[4].instID[lVar12];
              fVar27 = (float)pRVar16[6].instID[lVar12];
              fVar19 = (float)pRVar16[8].instID[lVar12];
              fVar39 = (float)pRVar16[10].instID[lVar12];
              fVar40 = (fVar67 - fVar76) * fVar80;
              fVar43 = (fVar67 - fVar77) * fVar81;
              fVar44 = (fVar67 - fVar78) * fVar82;
              fVar45 = (fVar67 - fVar79) * fVar83;
              fVar46 = (fVar19 - (float)local_1718._0_4_) * local_1708;
              fVar48 = (fVar19 - (float)local_1718._4_4_) * fStack_1704;
              fVar49 = (fVar19 - fStack_1710) * fStack_1700;
              fVar50 = (fVar19 - fStack_170c) * fStack_16fc;
              fVar67 = (float)pRVar16[0xc].instID[lVar12];
              fVar51 = (fVar67 - (float)local_1728) * fVar60;
              fVar52 = (fVar67 - local_1728._4_4_) * fVar62;
              fVar53 = (fVar67 - (float)uStack_1720) * fVar64;
              fVar54 = (fVar67 - uStack_1720._4_4_) * fVar66;
              fVar19 = (fVar27 - fVar76) * fVar80;
              fVar25 = (fVar27 - fVar77) * fVar81;
              fVar26 = (fVar27 - fVar78) * fVar82;
              fVar27 = (fVar27 - fVar79) * fVar83;
              fVar32 = (fVar39 - (float)local_1718._0_4_) * local_1708;
              fVar37 = (fVar39 - (float)local_1718._4_4_) * fStack_1704;
              fVar38 = (fVar39 - fStack_1710) * fStack_1700;
              fVar39 = (fVar39 - fStack_170c) * fStack_16fc;
              fVar67 = (float)pRVar16[0xe].instID[lVar12];
              fVar61 = (fVar67 - (float)local_1728) * fVar60;
              fVar63 = (fVar67 - local_1728._4_4_) * fVar62;
              fVar65 = (fVar67 - (float)uStack_1720) * fVar64;
              fVar67 = (fVar67 - uStack_1720._4_4_) * fVar66;
              uVar10 = (uint)((int)fVar19 < (int)fVar40) * (int)fVar19 |
                       (uint)((int)fVar19 >= (int)fVar40) * (int)fVar40;
              uVar57 = (uint)((int)fVar25 < (int)fVar43) * (int)fVar25 |
                       (uint)((int)fVar25 >= (int)fVar43) * (int)fVar43;
              uVar58 = (uint)((int)fVar26 < (int)fVar44) * (int)fVar26 |
                       (uint)((int)fVar26 >= (int)fVar44) * (int)fVar44;
              uVar59 = (uint)((int)fVar27 < (int)fVar45) * (int)fVar27 |
                       (uint)((int)fVar27 >= (int)fVar45) * (int)fVar45;
              uVar68 = (uint)((int)fVar32 < (int)fVar46) * (int)fVar32 |
                       (uint)((int)fVar32 >= (int)fVar46) * (int)fVar46;
              uVar69 = (uint)((int)fVar37 < (int)fVar48) * (int)fVar37 |
                       (uint)((int)fVar37 >= (int)fVar48) * (int)fVar48;
              uVar70 = (uint)((int)fVar38 < (int)fVar49) * (int)fVar38 |
                       (uint)((int)fVar38 >= (int)fVar49) * (int)fVar49;
              uVar71 = (uint)((int)fVar39 < (int)fVar50) * (int)fVar39 |
                       (uint)((int)fVar39 >= (int)fVar50) * (int)fVar50;
              uVar68 = ((int)uVar68 < (int)uVar10) * uVar10 | ((int)uVar68 >= (int)uVar10) * uVar68;
              uVar69 = ((int)uVar69 < (int)uVar57) * uVar57 | ((int)uVar69 >= (int)uVar57) * uVar69;
              uVar70 = ((int)uVar70 < (int)uVar58) * uVar58 | ((int)uVar70 >= (int)uVar58) * uVar70;
              uVar71 = ((int)uVar71 < (int)uVar59) * uVar59 | ((int)uVar71 >= (int)uVar59) * uVar71;
              uVar10 = (uint)((int)fVar61 < (int)fVar51) * (int)fVar61 |
                       (uint)((int)fVar61 >= (int)fVar51) * (int)fVar51;
              uVar57 = (uint)((int)fVar63 < (int)fVar52) * (int)fVar63 |
                       (uint)((int)fVar63 >= (int)fVar52) * (int)fVar52;
              uVar58 = (uint)((int)fVar65 < (int)fVar53) * (int)fVar65 |
                       (uint)((int)fVar65 >= (int)fVar53) * (int)fVar53;
              uVar59 = (uint)((int)fVar67 < (int)fVar54) * (int)fVar67 |
                       (uint)((int)fVar67 >= (int)fVar54) * (int)fVar54;
              auVar56._0_4_ =
                   ((int)uVar10 < (int)uVar68) * uVar68 | ((int)uVar10 >= (int)uVar68) * uVar10;
              auVar56._4_4_ =
                   ((int)uVar57 < (int)uVar69) * uVar69 | ((int)uVar57 >= (int)uVar69) * uVar57;
              auVar56._8_4_ =
                   ((int)uVar58 < (int)uVar70) * uVar70 | ((int)uVar58 >= (int)uVar70) * uVar58;
              auVar56._12_4_ =
                   ((int)uVar59 < (int)uVar71) * uVar71 | ((int)uVar59 >= (int)uVar71) * uVar59;
              uVar10 = (uint)((int)fVar19 < (int)fVar40) * (int)fVar40 |
                       (uint)((int)fVar19 >= (int)fVar40) * (int)fVar19;
              uVar57 = (uint)((int)fVar25 < (int)fVar43) * (int)fVar43 |
                       (uint)((int)fVar25 >= (int)fVar43) * (int)fVar25;
              uVar58 = (uint)((int)fVar26 < (int)fVar44) * (int)fVar44 |
                       (uint)((int)fVar26 >= (int)fVar44) * (int)fVar26;
              uVar59 = (uint)((int)fVar27 < (int)fVar45) * (int)fVar45 |
                       (uint)((int)fVar27 >= (int)fVar45) * (int)fVar27;
              uVar68 = (uint)((int)fVar32 < (int)fVar46) * (int)fVar46 |
                       (uint)((int)fVar32 >= (int)fVar46) * (int)fVar32;
              uVar69 = (uint)((int)fVar37 < (int)fVar48) * (int)fVar48 |
                       (uint)((int)fVar37 >= (int)fVar48) * (int)fVar37;
              uVar70 = (uint)((int)fVar38 < (int)fVar49) * (int)fVar49 |
                       (uint)((int)fVar38 >= (int)fVar49) * (int)fVar38;
              uVar71 = (uint)((int)fVar39 < (int)fVar50) * (int)fVar50 |
                       (uint)((int)fVar39 >= (int)fVar50) * (int)fVar39;
              uVar10 = ((int)uVar10 < (int)uVar68) * uVar10 | ((int)uVar10 >= (int)uVar68) * uVar68;
              uVar57 = ((int)uVar57 < (int)uVar69) * uVar57 | ((int)uVar57 >= (int)uVar69) * uVar69;
              uVar58 = ((int)uVar58 < (int)uVar70) * uVar58 | ((int)uVar58 >= (int)uVar70) * uVar70;
              uVar59 = ((int)uVar59 < (int)uVar71) * uVar59 | ((int)uVar59 >= (int)uVar71) * uVar71;
              uVar68 = (uint)((int)fVar61 < (int)fVar51) * (int)fVar51 |
                       (uint)((int)fVar61 >= (int)fVar51) * (int)fVar61;
              uVar69 = (uint)((int)fVar63 < (int)fVar52) * (int)fVar52 |
                       (uint)((int)fVar63 >= (int)fVar52) * (int)fVar63;
              uVar70 = (uint)((int)fVar65 < (int)fVar53) * (int)fVar53 |
                       (uint)((int)fVar65 >= (int)fVar53) * (int)fVar65;
              uVar71 = (uint)((int)fVar67 < (int)fVar54) * (int)fVar54 |
                       (uint)((int)fVar67 >= (int)fVar54) * (int)fVar67;
              uVar68 = (uint)(bi_8.field_0.i[0] < (int)uVar68) * bi_8.field_0.i[0] |
                       (bi_8.field_0.i[0] >= (int)uVar68) * uVar68;
              uVar69 = (uint)(bi_8.field_0.i[1] < (int)uVar69) * bi_8.field_0.i[1] |
                       (bi_8.field_0.i[1] >= (int)uVar69) * uVar69;
              uVar70 = (uint)(bi_8.field_0.i[2] < (int)uVar70) * bi_8.field_0.i[2] |
                       (bi_8.field_0.i[2] >= (int)uVar70) * uVar70;
              uVar71 = (uint)(bi_8.field_0.i[3] < (int)uVar71) * bi_8.field_0.i[3] |
                       (bi_8.field_0.i[3] >= (int)uVar71) * uVar71;
              auVar23._4_4_ =
                   -(uint)((float)((uint)((int)auVar56._4_4_ < (int)local_16f8._4_4_) *
                                   local_16f8._4_4_ |
                                  ((int)auVar56._4_4_ >= (int)local_16f8._4_4_) * auVar56._4_4_) <=
                          (float)(((int)uVar57 < (int)uVar69) * uVar57 |
                                 ((int)uVar57 >= (int)uVar69) * uVar69));
              auVar23._0_4_ =
                   -(uint)((float)((uint)((int)auVar56._0_4_ < (int)local_16f8._0_4_) *
                                   local_16f8._0_4_ |
                                  ((int)auVar56._0_4_ >= (int)local_16f8._0_4_) * auVar56._0_4_) <=
                          (float)(((int)uVar10 < (int)uVar68) * uVar10 |
                                 ((int)uVar10 >= (int)uVar68) * uVar68));
              auVar23._8_4_ =
                   -(uint)((float)((uint)((int)auVar56._8_4_ < (int)local_16f8._8_4_) *
                                   local_16f8._8_4_ |
                                  ((int)auVar56._8_4_ >= (int)local_16f8._8_4_) * auVar56._8_4_) <=
                          (float)(((int)uVar58 < (int)uVar70) * uVar58 |
                                 ((int)uVar58 >= (int)uVar70) * uVar70));
              auVar23._12_4_ =
                   -(uint)((float)((uint)((int)auVar56._12_4_ < (int)local_16f8._12_4_) *
                                   local_16f8._12_4_ |
                                  ((int)auVar56._12_4_ >= (int)local_16f8._12_4_) * auVar56._12_4_)
                          <= (float)(((int)uVar59 < (int)uVar71) * uVar59 |
                                    ((int)uVar59 >= (int)uVar71) * uVar71));
              uVar10 = movmskps((int)valid_i,auVar23);
              valid_i = (vint<4> *)(ulong)uVar10;
              pRVar4 = pRVar11;
              aVar34 = aVar30;
              if ((uVar10 != 0) &&
                 (auVar33._4_4_ = iVar18, auVar33._0_4_ = iVar17, auVar33._8_4_ = iVar84,
                 auVar33._12_4_ = iVar85,
                 aVar34 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                          blendvps(auVar33,auVar56,auVar23), pRVar4 = pRVar2,
                 pRVar11 != (RTCRayQueryContext *)0x8)) {
                pNVar13->ptr = (size_t)pRVar11;
                pNVar13 = pNVar13 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar14->v = aVar30;
                paVar14 = paVar14 + 1;
              }
              aVar30 = aVar34;
              pRVar11 = pRVar4;
            }
            pRVar16 = pRVar11;
          } while (pRVar11 != (RTCRayQueryContext *)0x8);
        }
        goto LAB_006d9afe;
      }
LAB_006d9e2f:
      auVar24._4_4_ = uVar73 & local_1808._4_4_;
      auVar24._0_4_ = uVar72 & local_1808._0_4_;
      auVar24._8_4_ = uVar74 & local_1808._8_4_;
      auVar24._12_4_ = uVar75 & local_1808._12_4_;
      auVar22 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f45a40,auVar24);
      *(undefined1 (*) [16])(ray + 0x80) = auVar22;
    }
  }
  return;
  while( true ) {
    local_17d0.geomID = *(uint *)(((ulong)pRVar16 & 0xfffffffffffffff0) + uVar15 * 8);
    local_17a0 = (context->scene->geometries).items[local_17d0.geomID].ptr;
    uVar10 = local_17a0->mask;
    auVar31._0_4_ = -(uint)((uVar10 & *(uint *)(ray + 0x90)) == 0);
    auVar31._4_4_ = -(uint)((uVar10 & *(uint *)(ray + 0x94)) == 0);
    auVar31._8_4_ = -(uint)((uVar10 & *(uint *)(ray + 0x98)) == 0);
    auVar31._12_4_ = -(uint)((uVar10 & *(uint *)(ray + 0x9c)) == 0);
    mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)(~auVar31 & auVar35);
    uVar68 = movmskps((int)pRVar11,(undefined1  [16])mask.field_0);
    pRVar11 = (RTCRayQueryContext *)(ulong)uVar68;
    local_1738 = auVar35;
    uVar10 = local_1748;
    uVar57 = uStack_1744;
    uVar58 = uStack_1740;
    uVar59 = uStack_173c;
    if (uVar68 != 0) {
      local_17d0.primID = *(uint *)(((ulong)pRVar16 & 0xfffffffffffffff0) + 4 + uVar15 * 8);
      local_17d0.valid = (int *)&mask;
      local_17d0.geometryUserPtr = local_17a0->userPtr;
      pRVar11 = context->user;
      local_17d0.N = 4;
      local_1798 = 0;
      local_1790 = context->args;
      p_Var9 = local_1790->intersect;
      if (p_Var9 == (RTCIntersectFunctionN)0x0) {
        p_Var9 = (RTCIntersectFunctionN)
                 local_17a0[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      }
      valid_i = (vint<4> *)&local_17d0;
      local_17d0.context = pRVar11;
      local_17d0.rayhit = (RTCRayHitN *)ray;
      local_17a0 = (Geometry *)(*p_Var9)((RTCIntersectFunctionNArguments *)valid_i);
      uVar10 = -(uint)(*(float *)(ray + 0x80) < 0.0);
      uVar57 = -(uint)(*(float *)(ray + 0x84) < 0.0);
      uVar58 = -(uint)(*(float *)(ray + 0x88) < 0.0);
      uVar59 = -(uint)(*(float *)(ray + 0x8c) < 0.0);
      iVar17 = 0x7f800000;
      iVar18 = 0x7f800000;
      iVar84 = 0x7f800000;
      iVar85 = 0x7f800000;
      uVar72 = local_1758;
      uVar73 = uStack_1754;
      uVar74 = uStack_1750;
      uVar75 = uStack_174c;
      fVar76 = local_1768;
      fVar77 = fStack_1764;
      fVar78 = fStack_1760;
      fVar79 = fStack_175c;
      fVar60 = local_1778;
      fVar62 = fStack_1774;
      fVar64 = fStack_1770;
      fVar66 = fStack_176c;
      fVar80 = local_1788;
      fVar81 = fStack_1784;
      fVar82 = fStack_1780;
      fVar83 = fStack_177c;
    }
    auVar35._0_8_ = CONCAT44(~uVar57 & local_1738._4_4_,~uVar10 & local_1738._0_4_);
    auVar35._8_4_ = ~uVar58 & local_1738._8_4_;
    auVar35._12_4_ = ~uVar59 & local_1738._12_4_;
    uVar10 = movmskps((int)local_17a0,auVar35);
    uVar8 = (ulong)uVar10;
    uVar15 = uVar15 + 1;
    auVar42._8_4_ = auVar35._8_4_;
    auVar42._0_8_ = auVar35._0_8_;
    auVar42._12_4_ = auVar35._12_4_;
    if (uVar10 == 0) break;
LAB_006d9ccd:
    auVar35 = auVar42;
    uVar5 = (undefined4)uVar8;
    if (uVar7 == uVar15) goto LAB_006d9dff;
  }
  uVar5 = 0;
LAB_006d9dff:
  auVar36._0_8_ = auVar35._0_8_ ^ 0xffffffffffffffff;
  auVar36._8_4_ = auVar35._8_4_ ^ 0xffffffff;
  auVar36._12_4_ = auVar35._12_4_ ^ 0xffffffff;
  local_1808 = local_1808 | auVar36;
  uVar10 = movmskps(uVar5,local_1808);
  puVar6 = (undefined1 *)(ulong)uVar10;
  if (uVar10 == 0xf) goto LAB_006d9e2f;
  bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 blendvps((undefined1  [16])bi_8.field_0,_DAT_01f45a40,local_1808);
  goto LAB_006d9afe;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }